

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int is_whitespace(char *s,int len)

{
  int local_20;
  int i;
  int len_local;
  char *s_local;
  
  if (s == (char *)0x0) {
    __assert_fail("s != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                  ,0x35,"int is_whitespace(const char *, int)");
  }
  local_20 = 0;
  while( true ) {
    if (len <= local_20) {
      return 1;
    }
    if ((((s[local_20] != ' ') && (s[local_20] != '\t')) && (s[local_20] != '\n')) &&
       (s[local_20] != '\r')) break;
    local_20 = local_20 + 1;
  }
  return 0;
}

Assistant:

static int is_whitespace(const char *s, int len)
{
    int i;

    assert(s != NULL);

    for (i = 0; i < len; i++)
    {
        if (s[i] != ' ' && s[i] != '\t' && s[i] != '\n' && s[i] != '\r')
        {
            return 0;
        }
    }

    return 1;
}